

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginVST2.cpp
# Opt level: O3

void __thiscall
DISTRHO::PluginVst::PluginVst(PluginVst *this,audioMasterCallback audioMaster,AEffect *effect)

{
  PrivateData *pPVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  long lVar9;
  
  (this->super_ParameterAndNotesHelper).parameterValues = (float *)0x0;
  (this->super_ParameterAndNotesHelper)._vptr_ParameterAndNotesHelper =
       (_func_int **)&PTR__PluginVst_0010fc80;
  PluginExporter::PluginExporter
            (&this->fPlugin,this,(writeMidiFunc)0x0,(requestParameterValueChangeFunc)0x0);
  this->fAudioMaster = audioMaster;
  this->fEffect = effect;
  this->fProgramName[8] = '\0';
  this->fProgramName[9] = '\0';
  this->fProgramName[10] = '\0';
  this->fProgramName[0xb] = '\0';
  this->fProgramName[0xc] = '\0';
  this->fProgramName[0xd] = '\0';
  this->fProgramName[0xe] = '\0';
  this->fProgramName[0xf] = '\0';
  this->fProgramName[0x10] = '\0';
  this->fProgramName[0x11] = '\0';
  this->fProgramName[0x12] = '\0';
  this->fProgramName[0x13] = '\0';
  this->fProgramName[0x14] = '\0';
  this->fProgramName[0x15] = '\0';
  this->fProgramName[0x16] = '\0';
  this->fProgramName[0x17] = '\0';
  this->fProgramName[0x11] = '\0';
  this->fProgramName[0x12] = '\0';
  this->fProgramName[0x13] = '\0';
  this->fProgramName[0x14] = '\0';
  this->fProgramName[0x15] = '\0';
  this->fProgramName[0x16] = '\0';
  this->fProgramName[0x17] = '\0';
  this->fProgramName[0x18] = '\0';
  this->fProgramName[0x19] = '\0';
  this->fProgramName[0x1a] = '\0';
  this->fProgramName[0x1b] = '\0';
  this->fProgramName[0x1c] = '\0';
  this->fProgramName[0x1d] = '\0';
  this->fProgramName[0x1e] = '\0';
  this->fProgramName[0x1f] = '\0';
  this->fProgramName[0x20] = '\0';
  builtin_strncpy(this->fProgramName,"Default",8);
  pPVar1 = (this->fPlugin).fData;
  if (pPVar1 == (PrivateData *)0x0) {
    d_stderr2("assertion failure: \"%s\" in file %s, line %i","fData != nullptr",
              "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
              ,0x20a);
    return;
  }
  uVar5 = (ulong)pPVar1->parameterCount;
  if (uVar5 != 0) {
    pfVar3 = (float *)operator_new__(uVar5 * 4);
    (this->super_ParameterAndNotesHelper).parameterValues = pfVar3;
    auVar2 = _DAT_0010b030;
    lVar9 = uVar5 - 1;
    auVar6._8_4_ = (int)lVar9;
    auVar6._0_8_ = lVar9;
    auVar6._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar4 = 0;
    auVar6 = auVar6 ^ _DAT_0010b030;
    auVar8 = _DAT_0010b010;
    auVar10 = _DAT_0010b020;
    do {
      auVar11 = auVar10 ^ auVar2;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar7 && auVar6._0_4_ < auVar11._0_4_ || iVar7 < auVar11._4_4_)
                & 1)) {
        *(undefined4 *)((long)pfVar3 + uVar4) = 0x7fc00000;
      }
      if ((auVar11._12_4_ != auVar6._12_4_ || auVar11._8_4_ <= auVar6._8_4_) &&
          auVar11._12_4_ <= auVar6._12_4_) {
        *(undefined4 *)((long)pfVar3 + uVar4 + 4) = 0x7fc00000;
      }
      auVar11 = auVar8 ^ auVar2;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar7 && (iVar12 != iVar7 || auVar11._0_4_ <= auVar6._0_4_)) {
        *(undefined4 *)((long)pfVar3 + uVar4 + 8) = 0x7fc00000;
        *(undefined4 *)((long)pfVar3 + uVar4 + 0xc) = 0x7fc00000;
      }
      lVar9 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar9 + 4;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar9 + 4;
      uVar4 = uVar4 + 0x10;
    } while ((uVar5 * 4 + 0xc & 0xfffffffffffffff0) != uVar4);
  }
  return;
}

Assistant:

PluginVst(const audioMasterCallback audioMaster, AEffect* const effect)
        : fPlugin(this, writeMidiCallback, requestParameterValueChangeCallback),
          fAudioMaster(audioMaster),
          fEffect(effect)
    {
        std::memset(fProgramName, 0, sizeof(char)*(32+1));
        std::strcpy(fProgramName, "Default");

        const uint32_t parameterCount = fPlugin.getParameterCount();

        if (parameterCount != 0)
        {
            parameterValues = new float[parameterCount];

            for (uint32_t i=0; i < parameterCount; ++i)
                parameterValues[i] = NAN;
        }

#if DISTRHO_PLUGIN_WANT_MIDI_INPUT
        fMidiEventCount = 0;
#endif

#if DISTRHO_PLUGIN_HAS_UI
        fVstUI           = nullptr;
        fVstRect.top     = 0;
        fVstRect.left    = 0;
        fVstRect.bottom  = 0;
        fVstRect.right   = 0;
        fLastScaleFactor = 0.0f;

        if (parameterCount != 0)
        {
            parameterChecks = new bool[parameterCount];
            memset(parameterChecks, 0, sizeof(bool)*parameterCount);
        }

# if DISTRHO_OS_MAC
#  ifdef __LP64__
        fUsingNsView = true;
#  else
#   ifndef DISTRHO_NO_WARNINGS
#    warning 32bit VST UIs on OSX only work if the host supports "hasCockosViewAsConfig"
#   endif
        fUsingNsView = false;
#  endif
# endif // DISTRHO_OS_MAC

# if DISTRHO_PLUGIN_WANT_MIDI_INPUT
        fNotesRingBuffer.setRingBuffer(&notesRingBuffer, true);
# endif
#endif // DISTRHO_PLUGIN_HAS_UI

#if DISTRHO_PLUGIN_WANT_STATE
        fStateChunk = nullptr;

        for (uint32_t i=0, count=fPlugin.getStateCount(); i<count; ++i)
        {
            const String& dkey(fPlugin.getStateKey(i));
            fStateMap[dkey] = fPlugin.getStateDefaultValue(i);
        }
#endif
    }